

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLCopy.cpp
# Opt level: O0

void XPMP2::CSLObj::SetOtherObjCopyResult(bool bResult)

{
  bool bVar1;
  CSLModel *pCVar2;
  iterator iVar3;
  _List_iterator<XPMP2::CSLObj> this;
  undefined8 uVar4;
  undefined8 uVar5;
  byte in_DIL;
  iterator iter;
  CSLModel *pCsl;
  iterator cslIter;
  list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_> *in_stack_ffffffffffffff48;
  iterator *in_stack_ffffffffffffff50;
  string *psVar6;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff68;
  string local_90 [48];
  string local_60 [32];
  _Self local_40 [2];
  _List_node_base *local_30;
  undefined1 bResult_00;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
  local_10;
  byte local_1;
  
  local_1 = in_DIL & 1;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
  ::_Rb_tree_iterator(&local_10);
  pCVar2 = CSLModelByKey(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if (pCVar2 == (CSLModel *)0x0) {
    if (glob < 4) {
      psVar6 = local_90;
      StripXPSysDir(in_stack_ffffffffffffff68);
      uVar4 = std::__cxx11::string::c_str();
      uVar5 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
             ,0xe1,"SetOtherObjCopyResult",logERR,"Copying %s: CSLModel \'%s\' not found!",uVar4,
             uVar5,psVar6);
      std::__cxx11::string::~string(local_90);
    }
  }
  else {
    iVar3 = std::__cxx11::list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_>::begin
                      (in_stack_ffffffffffffff48);
    local_30 = (_List_node_base *)
               std::__cxx11::list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_>::end
                         (in_stack_ffffffffffffff48);
    this = std::
           find_if<std::_List_iterator<XPMP2::CSLObj>,XPMP2::CSLObj::SetOtherObjCopyResult(bool)::__0>
                     (iVar3._M_node,local_30);
    bResult_00 = (undefined1)((ulong)iVar3._M_node >> 0x38);
    local_40[0]._M_node =
         (_List_node_base *)
         std::__cxx11::list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_>::end
                   (in_stack_ffffffffffffff48);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,local_40);
    if (bVar1) {
      std::_List_iterator<XPMP2::CSLObj>::operator->((_List_iterator<XPMP2::CSLObj> *)0x37fe5a);
      SetCopyResult((CSLObj *)this._M_node,(bool)bResult_00);
    }
    else if (glob < 4) {
      StripXPSysDir(in_stack_ffffffffffffff68);
      uVar4 = std::__cxx11::string::c_str();
      uVar5 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLCopy.cpp"
             ,0xdc,"SetOtherObjCopyResult",logERR,"Copying %s: CSLObj not found in CSLModel \'%s\'!"
             ,uVar4,uVar5);
      std::__cxx11::string::~string(local_60);
    }
  }
  return;
}

Assistant:

void CSLObj::SetOtherObjCopyResult (bool bResult)
{
    // Look for the CSLObj using the stored CSLId and path
    mapCSLModelTy::iterator cslIter;
    CSLModel* pCsl = CSLModelByKey(gThreadCSLkey);
    if (pCsl) {
        // find the object by path
        listCSLObjTy::iterator iter = std::find_if(pCsl->listObj.begin(),
                                                   pCsl->listObj.end(),
                                                   [](const CSLObj& o)
                                                   { return o.path == gThreadPath; });
        if (iter != pCsl->listObj.end())
            // Did find the CSL object!
            iter->SetCopyResult(bResult);
        else {
            LOG_MSG(logERR, ERR_CPY_OBJ_NOT_FOUND,
                    StripXPSysDir(gThreadPath).c_str(),
                    gThreadCSLkey.c_str());
        }
    } else {
        LOG_MSG(logERR, ERR_CPY_MDL_NOT_FOUND,
                StripXPSysDir(gThreadPath).c_str(),
                gThreadCSLkey.c_str());
    }
}